

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

TSourceLoc * __thiscall glslang::TInputScanner::getSourceLoc(TInputScanner *this)

{
  uint uVar1;
  uint uVar2;
  
  if (this->singleLogical == true) {
    return &this->logicalSourceLoc;
  }
  uVar2 = ~this->finale + this->numSources;
  if (this->currentSource <= (int)uVar2) {
    uVar2 = this->currentSource;
  }
  uVar1 = 0;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  return this->loc + uVar1;
}

Assistant:

const TSourceLoc& getSourceLoc() const
    {
        if (singleLogical) {
            return logicalSourceLoc;
        } else {
            return loc[std::max(0, std::min(currentSource, numSources - finale - 1))];
        }
    }